

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minijson_reader.hpp
# Opt level: O0

char minijson::detail::read_unquoted_value<minijson::buffer_context>
               (buffer_context *context,char first_char)

{
  char cVar1;
  int iVar2;
  ssize_t sVar3;
  parse_error *this;
  size_t in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *__buf;
  void *extraout_RDX_02;
  undefined7 in_register_00000031;
  ulong uVar4;
  bool bVar5;
  char c;
  char first_char_local;
  buffer_context *context_local;
  
  uVar4 = CONCAT71(in_register_00000031,first_char);
  if (first_char != '\0') {
    uVar4 = (ulong)(uint)(int)first_char;
    buffer_context_base::write(&context->super_buffer_context_base,(int)first_char,in_RDX,in_RCX);
    in_RDX = extraout_RDX;
  }
  while( true ) {
    sVar3 = buffer_context_base::read(&context->super_buffer_context_base,(int)uVar4,in_RDX,in_RCX);
    cVar1 = (char)sVar3;
    in_RCX = (size_t)(uint)(int)cVar1;
    bVar5 = false;
    __buf = extraout_RDX_00;
    if ((int)cVar1 != 0) {
      in_RCX = (size_t)(uint)(int)cVar1;
      bVar5 = false;
      if ((int)cVar1 != 0x2c) {
        in_RCX = (size_t)(uint)(int)cVar1;
        bVar5 = false;
        if ((int)cVar1 != 0x7d) {
          in_RCX = (size_t)(uint)(int)cVar1;
          bVar5 = false;
          if ((int)cVar1 != 0x5d) {
            iVar2 = isspace((int)cVar1);
            bVar5 = iVar2 == 0;
            __buf = extraout_RDX_01;
          }
        }
      }
    }
    if (!bVar5) break;
    uVar4 = (ulong)(uint)(int)cVar1;
    buffer_context_base::write(&context->super_buffer_context_base,(int)cVar1,__buf,in_RCX);
    in_RDX = extraout_RDX_02;
  }
  if (cVar1 != '\0') {
    buffer_context_base::write(&context->super_buffer_context_base,0,__buf,in_RCX);
    return cVar1;
  }
  this = (parse_error *)__cxa_allocate_exception(0x18);
  parse_error::parse_error<minijson::buffer_context>(this,context,UNTERMINATED_VALUE);
  __cxa_throw(this,&parse_error::typeinfo,parse_error::~parse_error);
}

Assistant:

char read_unquoted_value(Context& context, char first_char = 0)
{
    if (first_char != 0)
    {
        context.write(first_char);
    }

    char c;

    while (((c = context.read()) != 0) && (c != ',') && (c != '}') && (c != ']') && !isspace(c))
    {
        context.write(c);
    }

    if (c == 0)
    {
        throw parse_error(context, parse_error::UNTERMINATED_VALUE);
    }

    context.write(0);

    return c; // return the termination character (or it will be lost forever)
}